

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

xmlXPathObjectPtr xmlXPtrNewRangePointNode(xmlXPathObjectPtr start,xmlNodePtr end)

{
  xmlXPathObjectPtr range;
  
  if ((end == (xmlNodePtr)0x0 || start == (xmlXPathObjectPtr)0x0) || (start->type != XPATH_POINT)) {
    range = (xmlXPathObjectPtr)0x0;
  }
  else {
    range = xmlXPtrNewRangeInternal((xmlNodePtr)start->user,start->index,end,-1);
    xmlXPtrRangeCheckOrder(range);
  }
  return range;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrNewRangePointNode(xmlXPathObjectPtr start, xmlNodePtr end) {
    xmlXPathObjectPtr ret;

    if (start == NULL)
	return(NULL);
    if (end == NULL)
	return(NULL);
    if (start->type != XPATH_POINT)
	return(NULL);

    ret = xmlXPtrNewRangeInternal(start->user, start->index, end, -1);
    xmlXPtrRangeCheckOrder(ret);
    return(ret);
}